

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O2

string * ts2string_abi_cxx11_(string *__return_storage_ptr__,time_t t)

{
  allocator<char> local_91;
  time_t t_local;
  char szBuf [50];
  tm tm;
  
  t_local = t;
  gmtime_r(&t_local,(tm *)&tm);
  strftime(szBuf,0x31,"%Y-%m-%d %H:%M:%S",(tm *)&tm);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,szBuf,&local_91);
  return __return_storage_ptr__;
}

Assistant:

std::string ts2string (time_t t)
{
    // format it nicely
    char szBuf[50];
    struct tm tm;
    gmtime_s(&tm, &t);
    strftime(szBuf,
             sizeof(szBuf) - 1,
             "%Y-%m-%d %H:%M:%S",       // %F %T
             &tm);
    return std::string(szBuf);
}